

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gem_points.cpp
# Opt level: O3

void __thiscall Am_Point_List::Get(Am_Point_List *this,int *x,int *y)

{
  Am_Point_Item *pAVar1;
  double dVar2;
  
  pAVar1 = this->item;
  if (pAVar1 != (Am_Point_Item *)0x0) {
    dVar2 = floor((double)pAVar1->x + 0.5);
    *x = (int)dVar2;
    dVar2 = floor((double)pAVar1->y + 0.5);
    *y = (int)dVar2;
    return;
  }
  Am_Error("** Am_Point_List::Get: no item is current\n");
}

Assistant:

void
Am_Point_List::Get(int &x, int &y) const
{
  if (!item)
    Am_Error("** Am_Point_List::Get: no item is current\n");
  x = iround(item->x);
  y = iround(item->y);
}